

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap_F.cpp
# Opt level: O1

void __thiscall
amrex::MLEBABecLap::FFlux
          (MLEBABecLap *this,int amrlev,MFIter *mfi,Array<FArrayBox_*,_3> *flux,FArrayBox *sol,
          Location flux_loc,int face_only)

{
  Box *pBVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Location LVar14;
  Location LVar15;
  Vector<int,_std::allocator<int>_> *pVVar16;
  FArrayBox *pFVar17;
  FArrayBox *pFVar18;
  FArrayBox *pFVar19;
  FabArray<amrex::IArrayBox> *this_00;
  FArrayBox *pFVar20;
  double *pdVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  uint ncomp;
  FabType FVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  undefined8 uVar37;
  int iVar38;
  int *piVar39;
  int iVar40;
  int iVar41;
  undefined8 uVar42;
  long lVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int *piVar54;
  int iVar55;
  long lVar56;
  int *piVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  double *pdVar63;
  long lVar64;
  int iVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  double *pdVar70;
  int lof;
  int iVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  double *local_548;
  FabArray<amrex::EBCellFlagFab> *local_540;
  double *local_508;
  double *local_500;
  Box local_44c;
  double *local_430;
  long local_428;
  long local_420;
  long local_418;
  double *local_410;
  long local_408;
  long local_400;
  ulong local_3f8;
  long local_3f0;
  long local_3e8;
  Array4<const_int> local_3e0;
  MultiCutFab *local_3a0;
  MultiCutFab *local_398;
  MultiCutFab *local_390;
  MultiCutFab *local_388;
  MultiCutFab *local_380;
  MultiCutFab *local_378;
  Array4<const_double> local_370;
  undefined1 local_330 [32];
  Dim3 local_310 [2];
  int iStack_2f8;
  Array4<const_double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Box local_22c;
  Array4<const_double> local_210;
  undefined1 local_1d0 [16];
  FArrayBox *local_1c0;
  Long LStack_1b8;
  Long local_1b0;
  Long LStack_1a8;
  Dim3 local_1a0 [2];
  int iStack_188;
  double *local_180;
  long local_178;
  long local_170;
  long local_168;
  int local_160;
  int local_15c;
  int local_158;
  Dim3 local_154;
  int local_148;
  double local_140;
  double *local_138;
  long local_130;
  long local_128;
  long local_120;
  Dim3 local_118;
  ulong local_10c;
  int local_104;
  int local_100;
  double *local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  Dim3 local_d8;
  ulong local_cc;
  int local_c4;
  int local_c0;
  MultiCutFab *local_b8;
  MultiCutFab *pMStack_b0;
  MultiCutFab *local_a8;
  Long LStack_a0;
  Dim3 aDStack_98 [2];
  int iStack_80;
  int *local_78;
  Long LStack_70;
  Long local_68;
  Long LStack_60;
  Dim3 local_58 [2];
  int iStack_40;
  bool local_38;
  bool local_37;
  
  MFIter::tilebox(&local_44c,mfi);
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
  lVar30 = **(long **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  if (lVar30 == 0) {
    lVar30 = 0;
  }
  else {
    lVar30 = __dynamic_cast(lVar30,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar30 == 0) {
    local_540 = (FabArray<amrex::EBCellFlagFab> *)0x0;
  }
  else {
    local_540 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar30 + 0xd8));
  }
  pVVar16 = mfi->local_index_map;
  piVar39 = &mfi->currentIndex;
  piVar54 = piVar39;
  if (pVVar16 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar54 = (pVVar16->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar39;
  }
  lVar31 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  piVar57 = piVar39;
  if (pVVar16 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar57 = (pVVar16->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar39;
  }
  if (pVVar16 != (Vector<int,_std::allocator<int>_> *)0x0) {
    piVar39 = (pVVar16->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              + *piVar39;
  }
  lVar32 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  pFVar17 = *(FArrayBox **)(*(long *)(lVar31 + 0x108) + (long)*piVar54 * 8);
  pFVar18 = *(FArrayBox **)(*(long *)(lVar31 + 0x288) + (long)*piVar57 * 8);
  pFVar19 = *(FArrayBox **)(*(long *)(lVar31 + 0x408) + (long)*piVar39 * 8);
  this_00 = *(FabArray<amrex::IArrayBox> **)
             &(this->m_cc_mask).
              super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
              .
              super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[amrlev].
              super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
              super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>;
  pFVar20 = flux->_M_elems[0];
  local_548 = (pFVar20->super_BaseFab<double>).dptr;
  iVar65 = (pFVar20->super_BaseFab<double>).nvar;
  iVar47 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[0];
  iVar46 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
  iVar35 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
  iVar44 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[1];
  iVar38 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[2];
  pFVar20 = flux->_M_elems[1];
  local_508 = (pFVar20->super_BaseFab<double>).dptr;
  iVar6 = (pFVar20->super_BaseFab<double>).nvar;
  iVar7 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[0];
  iVar8 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[1];
  iVar9 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
  iVar51 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
  iVar40 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[1];
  iVar48 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[2];
  pFVar20 = flux->_M_elems[2];
  local_500 = (pFVar20->super_BaseFab<double>).dptr;
  iVar10 = (pFVar20->super_BaseFab<double>).nvar;
  iVar11 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[0];
  iVar12 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[1];
  iVar13 = (pFVar20->super_BaseFab<double>).domain.smallend.vect[2];
  iVar52 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[0];
  iVar71 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[1];
  iVar45 = (pFVar20->super_BaseFab<double>).domain.bigend.vect[2];
  if (local_540 == (FabArray<amrex::EBCellFlagFab> *)0x0) {
    FVar29 = regular;
  }
  else {
    piVar39 = &mfi->currentIndex;
    if (pVVar16 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar39 = (pVVar16->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + *piVar39;
    }
    FVar29 = EBCellFlagFab::getType
                       ((local_540->m_fabs_v).
                        super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[*piVar39],&local_44c);
  }
  if (FVar29 == regular) {
    local_1d0._0_8_ = pFVar17;
    local_1d0._8_8_ = pFVar18;
    local_1c0 = pFVar19;
    MLABecLaplacian::FFlux
              (&local_44c,(Real *)(lVar32 + 0x38),this->m_b_scalar,
               (Array<const_FArrayBox_*,_3> *)local_1d0,flux,sol,face_only,ncomp);
  }
  else {
    iVar35 = iVar35 + 1;
    iVar44 = iVar44 + 1;
    iVar51 = iVar51 + 1;
    iVar40 = iVar40 + 1;
    iVar52 = iVar52 + 1;
    iVar71 = iVar71 + 1;
    iVar38 = iVar38 + 1;
    iVar48 = iVar48 + 1;
    iVar45 = iVar45 + 1;
    local_178 = (long)(iVar35 - iVar47);
    lVar61 = (long)(iVar44 - iVar46);
    lVar66 = (long)(iVar51 - iVar7);
    lVar58 = (long)(iVar40 - iVar8);
    lVar31 = (long)(iVar52 - iVar11);
    lVar72 = (long)(iVar71 - iVar12);
    lVar62 = lVar61 * local_178;
    lVar59 = lVar58 * lVar66;
    lVar73 = lVar72 * lVar31;
    iVar41 = (~local_44c.btype.itype & 1) + local_44c.bigend.vect[0];
    iVar55 = (uint)((local_44c.btype.itype & 2) == 0) + local_44c.bigend.vect[1];
    iVar53 = (uint)((local_44c.btype.itype & 4) == 0) + local_44c.bigend.vect[2];
    lVar69 = (iVar38 - iVar5) * lVar62;
    lVar67 = (iVar48 - iVar9) * lVar59;
    lVar49 = (iVar45 - iVar13) * lVar73;
    if (FVar29 == covered) {
      lVar30 = (long)local_44c.smallend.vect[0];
      lVar32 = (long)local_44c.smallend.vect[1];
      lVar33 = (long)local_44c.smallend.vect[2];
      uVar34 = (ulong)ncomp;
      if (0 < (int)ncomp) {
        local_548 = local_548 +
                    (((((lVar33 - iVar5) * lVar61 + lVar32) - (long)iVar46) * local_178 + lVar30) -
                    (long)iVar47);
        uVar36 = 0;
        do {
          if (local_44c.smallend.vect[2] <= local_44c.bigend.vect[2]) {
            iVar65 = 0;
            pdVar63 = local_548;
            do {
              pdVar70 = pdVar63;
              iVar46 = (local_44c.bigend.vect[1] - local_44c.smallend.vect[1]) + 1;
              if (local_44c.smallend.vect[1] <= local_44c.bigend.vect[1]) {
                do {
                  if (local_44c.smallend.vect[0] <= iVar41) {
                    memset(pdVar70,0,(ulong)(uint)(iVar41 - local_44c.smallend.vect[0]) * 8 + 8);
                  }
                  pdVar70 = pdVar70 + ((long)iVar35 - (long)iVar47);
                  iVar46 = iVar46 + -1;
                } while (iVar46 != 0);
              }
              iVar65 = iVar65 + 1;
              pdVar63 = pdVar63 + lVar62;
            } while ((local_44c.bigend.vect[2] - local_44c.smallend.vect[2]) + 1 != iVar65);
          }
          uVar36 = uVar36 + 1;
          local_548 = local_548 + lVar69;
        } while (uVar36 != uVar34);
      }
      if (0 < (int)ncomp) {
        local_508 = local_508 +
                    (((((lVar33 - iVar9) * lVar58 + lVar32) - (long)iVar8) * lVar66 + lVar30) -
                    (long)iVar7);
        uVar36 = 0;
        do {
          if (local_44c.smallend.vect[2] <= local_44c.bigend.vect[2]) {
            iVar65 = 0;
            pdVar63 = local_508;
            do {
              pdVar70 = pdVar63;
              iVar47 = (iVar55 - local_44c.smallend.vect[1]) + 1;
              if (local_44c.smallend.vect[1] <= iVar55) {
                do {
                  if (local_44c.smallend.vect[0] <= local_44c.bigend.vect[0]) {
                    memset(pdVar70,0,
                           (ulong)(uint)(local_44c.bigend.vect[0] - local_44c.smallend.vect[0]) * 8
                           + 8);
                  }
                  pdVar70 = pdVar70 + ((long)iVar51 - (long)iVar7);
                  iVar47 = iVar47 + -1;
                } while (iVar47 != 0);
              }
              iVar65 = iVar65 + 1;
              pdVar63 = pdVar63 + lVar59;
            } while ((local_44c.bigend.vect[2] - local_44c.smallend.vect[2]) + 1 != iVar65);
          }
          uVar36 = uVar36 + 1;
          local_508 = local_508 + lVar67;
        } while (uVar36 != uVar34);
      }
      if (0 < (int)ncomp) {
        local_500 = local_500 +
                    (((((lVar33 - iVar13) * lVar72 + lVar32) - (long)iVar12) * lVar31 + lVar30) -
                    (long)iVar11);
        uVar36 = 0;
        do {
          if (local_44c.smallend.vect[2] <= iVar53) {
            iVar65 = 0;
            pdVar63 = local_500;
            do {
              pdVar70 = pdVar63;
              iVar47 = (local_44c.bigend.vect[1] - local_44c.smallend.vect[1]) + 1;
              if (local_44c.smallend.vect[1] <= local_44c.bigend.vect[1]) {
                do {
                  if (local_44c.smallend.vect[0] <= local_44c.bigend.vect[0]) {
                    memset(pdVar70,0,
                           (ulong)(uint)(local_44c.bigend.vect[0] - local_44c.smallend.vect[0]) * 8
                           + 8);
                  }
                  pdVar70 = pdVar70 + ((long)iVar52 - (long)iVar11);
                  iVar47 = iVar47 + -1;
                } while (iVar47 != 0);
              }
              iVar65 = iVar65 + 1;
              pdVar63 = pdVar63 + lVar73;
            } while ((iVar53 - local_44c.smallend.vect[2]) + 1 != iVar65);
          }
          uVar36 = uVar36 + 1;
          local_500 = local_500 + lVar49;
        } while (uVar36 != uVar34);
      }
    }
    else {
      local_154.y = iVar44;
      local_154.x = iVar35;
      uVar42._4_4_ = iVar40;
      uVar42._0_4_ = iVar51;
      uVar37._4_4_ = iVar71;
      uVar37._0_4_ = iVar52;
      local_180 = local_548;
      local_170 = lVar62;
      local_168 = lVar69;
      local_160 = iVar47;
      local_15c = iVar46;
      local_158 = iVar5;
      local_154.z = iVar38;
      local_148 = iVar65;
      local_1d0._8_4_ = iVar41;
      if (flux_loc == FaceCentroid) {
        EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar30 + 0xd8));
        EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar30 + 0xd8));
        MultiCutFab::const_array(&local_270,local_388,mfi);
        MultiCutFab::const_array(&local_2b0,local_380,mfi);
        MultiCutFab::const_array(&local_2f0,local_378,mfi);
        MultiCutFab::const_array((Array4<const_double> *)local_330,local_3a0,mfi);
        MultiCutFab::const_array(&local_370,local_398,mfi);
        MultiCutFab::const_array(&local_210,local_390,mfi);
        pBVar1 = &(sol->super_BaseFab<double>).domain;
        uVar22._0_4_ = (pBVar1->smallend).vect[0];
        uVar22._4_4_ = (pBVar1->smallend).vect[1];
        lVar58 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        lVar30 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
        lVar50 = (lVar30 - (pBVar1->smallend).vect[0]) + 1;
        uVar34 = lVar30 + 1U & 0xffffffff | lVar58 << 0x20;
        pBVar1 = &(pFVar17->super_BaseFab<double>).domain;
        uVar23._0_4_ = (pBVar1->smallend).vect[0];
        uVar23._4_4_ = (pBVar1->smallend).vect[1];
        lVar62 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        lVar30 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[0];
        local_3f0 = (lVar30 - (pBVar1->smallend).vect[0]) + 1;
        local_3f8 = lVar30 + 1U & 0xffffffff | lVar62 << 0x20;
        lVar74 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar18->super_BaseFab<double>).domain;
        uVar24._0_4_ = (pBVar1->smallend).vect[0];
        uVar24._4_4_ = (pBVar1->smallend).vect[1];
        lVar69 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[0];
        lVar60 = (lVar69 - (pBVar1->smallend).vect[0]) + 1;
        lVar33 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
        uVar25._0_4_ = (pBVar1->smallend).vect[0];
        uVar25._4_4_ = (pBVar1->smallend).vect[1];
        lVar72 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
        lVar68 = (lVar72 - (pBVar1->smallend).vect[0]) + 1;
        pdVar63 = (sol->super_BaseFab<double>).dptr;
        iVar65 = (sol->super_BaseFab<double>).nvar;
        iVar47 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
        lVar30 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar56 = (lVar58 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar50;
        lVar58 = (lVar30 - iVar47) * lVar56;
        local_430 = (pFVar17->super_BaseFab<double>).dptr;
        iVar46 = (pFVar17->super_BaseFab<double>).nvar;
        local_428 = (long)(pFVar17->super_BaseFab<double>).domain.smallend.vect[2];
        lVar61 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_418 = (lVar62 - (pFVar17->super_BaseFab<double>).domain.smallend.vect[1]) * local_3f0;
        lVar64 = (lVar61 - local_428) * local_418;
        local_410 = (pFVar18->super_BaseFab<double>).dptr;
        iVar5 = (pFVar18->super_BaseFab<double>).nvar;
        local_408 = (long)(pFVar18->super_BaseFab<double>).domain.smallend.vect[2];
        local_400 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar75 = (lVar74 - (pFVar18->super_BaseFab<double>).domain.smallend.vect[1]) * lVar60;
        local_420 = (local_400 - local_408) * lVar75;
        pdVar70 = (pFVar19->super_BaseFab<double>).dptr;
        iVar35 = (pFVar19->super_BaseFab<double>).nvar;
        iVar44 = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
        lVar62 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar43 = (lVar33 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * lVar68;
        local_3e8 = (lVar62 - iVar44) * lVar43;
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_3e0,this_00,mfi);
        dVar2 = this->m_b_scalar;
        local_140 = *(double *)(lVar32 + 0x38) * dVar2;
        dVar3 = *(double *)(lVar32 + 0x40);
        dVar4 = *(double *)(lVar32 + 0x48);
        LVar14 = this->m_beta_loc;
        LVar15 = this->m_phi_loc;
        if (LVar15 == CellCentroid) {
          Abort_host("phi_on_centroid is still a WIP");
        }
        local_22c.smallend.vect[0] = local_44c.smallend.vect[0];
        local_22c.smallend.vect[1] = local_44c.smallend.vect[1];
        local_22c.smallend.vect[2] = local_44c.smallend.vect[2];
        local_22c.bigend.vect[1] = local_44c.bigend.vect[1];
        local_22c.bigend.vect[2] = local_44c.bigend.vect[2];
        local_1d0._4_4_ = local_44c.smallend.vect[0];
        local_1d0._0_4_ = face_only;
        local_1c0 = (FArrayBox *)local_270.p;
        LStack_1b8 = local_270.jstride;
        local_1b0 = local_270.kstride;
        LStack_1a8 = local_270.nstride;
        local_1a0[0].x = local_270.begin.x;
        local_1a0[0].y = local_270.begin.y;
        local_1a0[1].z = local_270.end.z;
        iStack_188 = local_270.ncomp;
        local_138 = local_430;
        local_130 = local_3f0;
        local_128 = local_418;
        local_118.z = (int)local_428;
        local_10c = local_3f8;
        local_104 = (int)lVar61;
        local_38 = LVar14 == FaceCentroid;
        iVar38 = (int)lVar30;
        local_37 = LVar15 == CellCentroid;
        aDStack_98[1].z = local_310[1].z;
        iStack_80 = iStack_2f8;
        aDStack_98[0].x = local_310[0].x;
        aDStack_98[0].y = local_310[0].y;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_22c.bigend.vect[0] = iVar41;
        local_22c.btype.itype = local_44c.btype.itype | 1;
        local_120 = lVar64;
        local_118._0_8_ = uVar23;
        local_100 = iVar46;
        local_f8 = pdVar63;
        local_f0 = lVar50;
        local_e8 = lVar56;
        local_e0 = lVar58;
        local_d8._0_8_ = uVar22;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        LoopConcurrent<amrex::mlebabeclap_flux_x(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_22c,ncomp,(anon_class_416_12_0bbc6dcc *)local_1d0);
        local_22c.smallend.vect[0] = local_44c.smallend.vect[0];
        local_22c.smallend.vect[1] = local_44c.smallend.vect[1];
        local_22c.smallend.vect[2] = local_44c.smallend.vect[2];
        local_22c.bigend.vect[0] = local_44c.bigend.vect[0];
        local_22c.bigend.vect[2] = local_44c.bigend.vect[2];
        local_1d0._4_4_ = local_44c.smallend.vect[1];
        local_1c0 = (FArrayBox *)local_2b0.p;
        LStack_1b8 = local_2b0.jstride;
        local_1b0 = local_2b0.kstride;
        LStack_1a8 = local_2b0.nstride;
        local_1a0[0].x = local_2b0.begin.x;
        local_1a0[0].y = local_2b0.begin.y;
        local_1a0[1].z = local_2b0.end.z;
        iStack_188 = local_2b0.ncomp;
        local_138 = local_410;
        local_120 = local_420;
        local_118.z = (int)local_408;
        local_104 = (int)local_400;
        local_38 = LVar14 == FaceCentroid;
        local_37 = LVar15 == CellCentroid;
        aDStack_98[1].z = local_370.end.z;
        iStack_80 = local_370.ncomp;
        aDStack_98[0].x = local_370.begin.x;
        aDStack_98[0].y = local_370.begin.y;
        local_a8 = (MultiCutFab *)local_370.kstride;
        LStack_a0 = local_370.nstride;
        local_b8 = (MultiCutFab *)local_370.p;
        pMStack_b0 = (MultiCutFab *)local_370.jstride;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_22c.bigend.vect[1] = iVar55;
        local_22c.btype.itype = local_44c.btype.itype | 2;
        local_180 = local_508;
        local_178 = lVar66;
        local_170 = lVar59;
        local_168 = lVar67;
        local_160 = iVar7;
        local_15c = iVar8;
        local_158 = iVar9;
        local_154._0_8_ = uVar42;
        local_154.z = iVar48;
        local_148 = iVar6;
        local_140 = dVar3 * dVar2;
        local_130 = lVar60;
        local_128 = lVar75;
        local_118._0_8_ = uVar24;
        local_10c = lVar69 + 1U & 0xffffffff | lVar74 << 0x20;
        local_100 = iVar5;
        local_f8 = pdVar63;
        local_f0 = lVar50;
        local_e8 = lVar56;
        local_e0 = lVar58;
        local_d8._0_8_ = uVar22;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        local_1d0._8_4_ = iVar55;
        LoopConcurrent<amrex::mlebabeclap_flux_y(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_22c,ncomp,(anon_class_416_12_3e7d91eb *)local_1d0);
        local_22c.smallend.vect[0] = local_44c.smallend.vect[0];
        local_22c.smallend.vect[1] = local_44c.smallend.vect[1];
        local_22c.smallend.vect[2] = local_44c.smallend.vect[2];
        local_22c.bigend.vect[0] = local_44c.bigend.vect[0];
        local_22c.bigend.vect[1] = local_44c.bigend.vect[1];
        local_38 = LVar14 == FaceCentroid;
        local_1d0._4_4_ = local_44c.smallend.vect[2];
        local_1d0._8_4_ = iVar53;
        local_1c0 = (FArrayBox *)local_2f0.p;
        LStack_1b8 = local_2f0.jstride;
        local_1b0 = local_2f0.kstride;
        LStack_1a8 = local_2f0.nstride;
        local_1a0[0].x = local_2f0.begin.x;
        local_1a0[0].y = local_2f0.begin.y;
        local_1a0[1].z = local_2f0.end.z;
        iStack_188 = local_2f0.ncomp;
        local_120 = local_3e8;
        local_104 = (int)lVar62;
        local_37 = LVar15 == CellCentroid;
        aDStack_98[1].z = local_210.end.z;
        iStack_80 = local_210.ncomp;
        aDStack_98[0].x = local_210.begin.x;
        aDStack_98[0].y = local_210.begin.y;
        local_a8 = (MultiCutFab *)local_210.kstride;
        LStack_a0 = local_210.nstride;
        local_b8 = (MultiCutFab *)local_210.p;
        pMStack_b0 = (MultiCutFab *)local_210.jstride;
        local_78 = local_3e0.p;
        LStack_70 = local_3e0.jstride;
        local_68 = local_3e0.kstride;
        LStack_60 = local_3e0.nstride;
        local_58[0].x = local_3e0.begin.x;
        local_58[0].y = local_3e0.begin.y;
        local_58[1].z = local_3e0.end.z;
        iStack_40 = local_3e0.ncomp;
        local_22c.bigend.vect[2] = iVar53;
        local_22c.btype.itype = local_44c.btype.itype | 4;
        local_180 = local_500;
        local_178 = lVar31;
        local_170 = lVar73;
        local_168 = lVar49;
        local_160 = iVar11;
        local_15c = iVar12;
        local_158 = iVar13;
        local_154._0_8_ = uVar37;
        local_154.z = iVar45;
        local_148 = iVar10;
        local_140 = dVar2 * dVar4;
        local_138 = pdVar70;
        local_130 = lVar68;
        local_128 = lVar43;
        local_118._0_8_ = uVar25;
        local_118.z = iVar44;
        local_10c = lVar72 + 1U & 0xffffffff | lVar33 << 0x20;
        local_100 = iVar35;
        local_f8 = pdVar63;
        local_f0 = lVar50;
        local_e8 = lVar56;
        local_e0 = lVar58;
        local_d8._0_8_ = uVar22;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        LoopConcurrent<amrex::mlebabeclap_flux_z(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,double,int,int,amrex::Box_const&,bool,bool)::_lambda(int,int,int,int)_1_>
                  (&local_22c,ncomp,(anon_class_416_12_713eb60a *)local_1d0);
      }
      else {
        EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar30 + 0xd8));
        MultiCutFab::const_array(&local_270,(MultiCutFab *)local_370.p,mfi);
        MultiCutFab::const_array(&local_2b0,(MultiCutFab *)local_370.jstride,mfi);
        MultiCutFab::const_array(&local_2f0,(MultiCutFab *)local_370.kstride,mfi);
        lVar69 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(sol->super_BaseFab<double>).domain;
        uVar28._0_4_ = (pBVar1->smallend).vect[0];
        uVar28._4_4_ = (pBVar1->smallend).vect[1];
        lVar30 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[0];
        lVar58 = (lVar30 - (pBVar1->smallend).vect[0]) + 1;
        uVar34 = lVar30 + 1U & 0xffffffff | lVar69 << 0x20;
        lVar33 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar17->super_BaseFab<double>).domain;
        local_118.x = (pBVar1->smallend).vect[0];
        local_118.y = (pBVar1->smallend).vect[1];
        lVar30 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[0];
        local_130 = (lVar30 - (pBVar1->smallend).vect[0]) + 1;
        local_10c = lVar30 + 1U & 0xffffffff | lVar33 << 0x20;
        lVar72 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar18->super_BaseFab<double>).domain;
        uVar26._0_4_ = (pBVar1->smallend).vect[0];
        uVar26._4_4_ = (pBVar1->smallend).vect[1];
        lVar56 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[0];
        lVar61 = (lVar56 - (pBVar1->smallend).vect[0]) + 1;
        lVar62 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[1] + 1;
        pBVar1 = &(pFVar19->super_BaseFab<double>).domain;
        uVar27._0_4_ = (pBVar1->smallend).vect[0];
        uVar27._4_4_ = (pBVar1->smallend).vect[1];
        lVar60 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[0];
        lVar30 = (lVar60 - (pBVar1->smallend).vect[0]) + 1;
        dVar2 = this->m_b_scalar;
        local_140 = *(double *)(lVar32 + 0x38) * dVar2;
        dVar3 = *(double *)(lVar32 + 0x40);
        dVar4 = *(double *)(lVar32 + 0x48);
        pdVar63 = (sol->super_BaseFab<double>).dptr;
        iVar65 = (sol->super_BaseFab<double>).nvar;
        iVar47 = (sol->super_BaseFab<double>).domain.smallend.vect[2];
        local_138 = (pFVar17->super_BaseFab<double>).dptr;
        local_100 = (pFVar17->super_BaseFab<double>).nvar;
        local_118.z = (pFVar17->super_BaseFab<double>).domain.smallend.vect[2];
        pdVar70 = (pFVar18->super_BaseFab<double>).dptr;
        iVar46 = (pFVar18->super_BaseFab<double>).nvar;
        iVar5 = (pFVar18->super_BaseFab<double>).domain.smallend.vect[2];
        pdVar21 = (pFVar19->super_BaseFab<double>).dptr;
        iVar35 = (pFVar19->super_BaseFab<double>).nvar;
        iVar44 = (pFVar19->super_BaseFab<double>).domain.smallend.vect[2];
        local_330._0_4_ = local_44c.smallend.vect[0];
        local_330._4_4_ = local_44c.smallend.vect[1];
        local_330._8_4_ = local_44c.smallend.vect[2];
        local_330._16_4_ = local_44c.bigend.vect[1];
        local_330._20_4_ = local_44c.bigend.vect[2];
        local_1d0._4_4_ = local_44c.smallend.vect[0];
        local_1d0._0_4_ = face_only;
        local_1c0 = (FArrayBox *)local_270.p;
        LStack_1b8 = local_270.jstride;
        local_1b0 = local_270.kstride;
        LStack_1a8 = local_270.nstride;
        local_1a0[0].x = local_270.begin.x;
        local_1a0[0].y = local_270.begin.y;
        local_1a0[1].z = local_270.end.z;
        iStack_188 = local_270.ncomp;
        local_128 = (lVar33 - (pFVar17->super_BaseFab<double>).domain.smallend.vect[1]) * local_130;
        lVar32 = (long)(pFVar17->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        local_120 = (lVar32 - local_118.z) * local_128;
        local_104 = (int)lVar32;
        lVar43 = (long)(sol->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar33 = (lVar69 - (sol->super_BaseFab<double>).domain.smallend.vect[1]) * lVar58;
        lVar68 = (lVar43 - iVar47) * lVar33;
        lVar64 = (long)(pFVar18->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar69 = (lVar72 - (pFVar18->super_BaseFab<double>).domain.smallend.vect[1]) * lVar61;
        lVar50 = (long)(pFVar19->super_BaseFab<double>).domain.bigend.vect[2] + 1;
        lVar32 = (lVar62 - (pFVar19->super_BaseFab<double>).domain.smallend.vect[1]) * lVar30;
        iVar38 = (int)lVar43;
        local_330._12_4_ = iVar41;
        local_330._24_4_ = local_44c.btype.itype | 1;
        local_f8 = pdVar63;
        local_f0 = lVar58;
        local_e8 = lVar33;
        local_e0 = lVar68;
        local_d8._0_8_ = uVar28;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        LoopConcurrent<amrex::mlebabeclap_flux_x_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76b9537a *)local_1d0);
        local_330._0_4_ = local_44c.smallend.vect[0];
        local_330._4_4_ = local_44c.smallend.vect[1];
        local_330._8_4_ = local_44c.smallend.vect[2];
        local_330._12_4_ = local_44c.bigend.vect[0];
        local_330._20_4_ = local_44c.bigend.vect[2];
        local_1d0._4_4_ = local_44c.smallend.vect[1];
        local_1c0 = (FArrayBox *)local_2b0.p;
        LStack_1b8 = local_2b0.jstride;
        local_1b0 = local_2b0.kstride;
        LStack_1a8 = local_2b0.nstride;
        local_1a0[0].x = local_2b0.begin.x;
        local_1a0[0].y = local_2b0.begin.y;
        local_1a0[1].z = local_2b0.end.z;
        iStack_188 = local_2b0.ncomp;
        local_104 = (int)lVar64;
        local_330._16_4_ = iVar55;
        local_330._24_4_ = local_44c.btype.itype | 2;
        local_180 = local_508;
        local_178 = lVar66;
        local_170 = lVar59;
        local_168 = lVar67;
        local_160 = iVar7;
        local_15c = iVar8;
        local_158 = iVar9;
        local_154._0_8_ = uVar42;
        local_154.z = iVar48;
        local_148 = iVar6;
        local_140 = dVar3 * dVar2;
        local_138 = pdVar70;
        local_130 = lVar61;
        local_128 = lVar69;
        local_120 = (lVar64 - iVar5) * lVar69;
        local_118._0_8_ = uVar26;
        local_118.z = iVar5;
        local_10c = lVar56 + 1U & 0xffffffff | lVar72 << 0x20;
        local_100 = iVar46;
        local_f8 = pdVar63;
        local_f0 = lVar58;
        local_e8 = lVar33;
        local_e0 = lVar68;
        local_d8._0_8_ = uVar28;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        local_1d0._8_4_ = iVar55;
        LoopConcurrent<amrex::mlebabeclap_flux_y_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76c7e33a *)local_1d0);
        local_330._0_4_ = local_44c.smallend.vect[0];
        local_330._4_4_ = local_44c.smallend.vect[1];
        local_330._8_4_ = local_44c.smallend.vect[2];
        local_330._12_4_ = local_44c.bigend.vect[0];
        local_330._16_4_ = local_44c.bigend.vect[1];
        local_1d0._4_4_ = local_44c.smallend.vect[2];
        local_1d0._8_4_ = iVar53;
        local_1c0 = (FArrayBox *)local_2f0.p;
        LStack_1b8 = local_2f0.jstride;
        local_1b0 = local_2f0.kstride;
        LStack_1a8 = local_2f0.nstride;
        local_1a0[0].x = local_2f0.begin.x;
        local_1a0[0].y = local_2f0.begin.y;
        local_1a0[1].z = local_2f0.end.z;
        iStack_188 = local_2f0.ncomp;
        local_104 = (int)lVar50;
        local_330._20_4_ = iVar53;
        local_330._24_4_ = local_44c.btype.itype | 4;
        local_180 = local_500;
        local_178 = lVar31;
        local_170 = lVar73;
        local_168 = lVar49;
        local_160 = iVar11;
        local_15c = iVar12;
        local_158 = iVar13;
        local_154._0_8_ = uVar37;
        local_154.z = iVar45;
        local_148 = iVar10;
        local_140 = dVar2 * dVar4;
        local_138 = pdVar21;
        local_130 = lVar30;
        local_128 = lVar32;
        local_120 = (lVar50 - iVar44) * lVar32;
        local_118._0_8_ = uVar27;
        local_118.z = iVar44;
        local_10c = lVar60 + 1U & 0xffffffff | lVar62 << 0x20;
        local_100 = iVar35;
        local_f8 = pdVar63;
        local_f0 = lVar58;
        local_e8 = lVar33;
        local_e0 = lVar68;
        local_d8._0_8_ = uVar28;
        local_d8.z = iVar47;
        local_cc = uVar34;
        local_c4 = iVar38;
        local_c0 = iVar65;
        LoopConcurrent<amrex::mlebabeclap_flux_z_0(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,double,int,int,amrex::Box_const&)::_lambda(int,int,int,int)_1_>
                  ((Box *)local_330,ncomp,(anon_class_280_8_76d672fa *)local_1d0);
      }
    }
  }
  return;
}

Assistant:

void
MLEBABecLap::FFlux (int amrlev, const MFIter& mfi, const Array<FArrayBox*,AMREX_SPACEDIM>& flux,
                    const FArrayBox& sol, Location flux_loc, const int face_only) const
{
    BL_PROFILE("MLEBABecLap::FFlux()");
    const int compute_flux_at_centroid = (Location::FaceCentroid == flux_loc) ? 1 : 0;
    const int mglev = 0;
    const Box& box = mfi.tilebox();
    const int ncomp = getNComp();

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    AMREX_D_TERM(const auto& bx = m_b_coeffs[amrlev][mglev][0][mfi];,
                 const auto& by = m_b_coeffs[amrlev][mglev][1][mfi];,
                 const auto& bz = m_b_coeffs[amrlev][mglev][2][mfi];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(box,0);,
                 Box const& ybx = amrex::surroundingNodes(box,1);,
                 Box const& zbx = amrex::surroundingNodes(box,2););
    AMREX_D_TERM(Array4<Real> const& fx = flux[0]->array();,
                 Array4<Real> const& fy = flux[1]->array();,
                 Array4<Real> const& fz = flux[2]->array(););

    const auto fabtyp = (flags) ? (*flags)[mfi].getType(box) : FabType::regular;
    if (fabtyp == FabType::covered) {
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(xbx, ncomp, i, j, k, n,
        {
            fx(i,j,k,n) = 0.0;
        });
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(ybx, ncomp, i, j, k, n,
        {
            fy(i,j,k,n) = 0.0;
        });
#if (AMREX_SPACEDIM == 3)
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D(zbx, ncomp, i, j, k, n,
        {
            fz(i,j,k,n) = 0.0;
        });
#endif
    } else if (fabtyp == FabType::regular) {
        MLABecLaplacian::FFlux(box, dxinv, m_b_scalar,
                               Array<FArrayBox const*,AMREX_SPACEDIM>{AMREX_D_DECL(&bx,&by,&bz)},
                               flux, sol, face_only, ncomp);
    } else if (compute_flux_at_centroid) {
        const auto& area = factory->getAreaFrac();
        const auto& fcent = factory->getFaceCent();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                     Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                     Array4<Real const> const& fcz = fcent[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        Array4<int const> const& msk = ccmask.const_array(mfi);
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);
        bool  phi_on_centroid = (m_phi_loc  == Location::CellCentroid);

        if (phi_on_centroid) amrex::Abort("phi_on_centroid is still a WIP");

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x(txbx, fx, apx, fcx, phi, bxcoef, msk, dhx, face_only, ncomp, xbx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y(tybx, fy, apy, fcy, phi, bycoef, msk, dhy, face_only, ncomp, ybx,
                                   beta_on_centroid, phi_on_centroid);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z(tzbx, fz, apz, fcz, phi, bzcoef, msk, dhz, face_only, ncomp, zbx,
                                   beta_on_centroid, phi_on_centroid);
            }
        );
    } else {
        const auto& area = factory->getAreaFrac();
        AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                     Array4<Real const> const& apy = area[1]->const_array(mfi);,
                     Array4<Real const> const& apz = area[2]->const_array(mfi););
        Array4<Real const> const& phi = sol.const_array();
        AMREX_D_TERM(Array4<Real const> const& bxcoef = bx.const_array();,
                     Array4<Real const> const& bycoef = by.const_array();,
                     Array4<Real const> const& bzcoef = bz.const_array(););
        AMREX_D_TERM(Real dhx = m_b_scalar*dxinv[0];,
                     Real dhy = m_b_scalar*dxinv[1];,
                     Real dhz = m_b_scalar*dxinv[2];);

        AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM (
            xbx, txbx,
            {
                mlebabeclap_flux_x_0(txbx, fx, apx, phi, bxcoef, dhx, face_only, ncomp, xbx);
            }
            , ybx, tybx,
            {
                mlebabeclap_flux_y_0(tybx, fy, apy, phi, bycoef, dhy, face_only, ncomp, ybx);
            }
            , zbx, tzbx,
            {
                mlebabeclap_flux_z_0(tzbx, fz, apz, phi, bzcoef, dhz, face_only, ncomp, zbx);
            }
        );
    }
}